

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStructGet(TranslateToFuzzReader *this,Type type)

{
  ulong uVar1;
  key_type kVar2;
  bool bVar3;
  mapped_type *vec;
  value_type *pvVar4;
  Expression *pEVar5;
  long *plVar6;
  Expression *pEVar7;
  undefined4 uStack_40;
  key_type local_38;
  Type type_local;
  
  local_38.id = type.id;
  vec = std::__detail::
        _Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::vector<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&this->typeStructFields,&local_38);
  if ((vec->
      super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (vec->
      super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pvVar4 = Random::
             pick<std::vector<std::pair<wasm::HeapType,unsigned_int>,std::allocator<std::pair<wasm::HeapType,unsigned_int>>>>
                       (&this->random,vec);
    uVar1 = *(ulong *)&pvVar4->second;
    pEVar5 = makeTrappingRefUse(this,(HeapType)(pvVar4->first).id);
    plVar6 = (long *)wasm::HeapType::getStruct();
    bVar3 = maybeSignedGet(this,(Field *)((uVar1 & 0xffffffff) * 0x10 + *plVar6));
    kVar2.id = local_38.id;
    uStack_40 = (undefined4)uVar1;
    pEVar7 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x28,8);
    pEVar7->_id = StructGetId;
    *(undefined4 *)(pEVar7 + 1) = uStack_40;
    pEVar7[1].type.id = (uintptr_t)pEVar5;
    (pEVar7->type).id = kVar2.id;
    pEVar7[2]._id = bVar3;
    *(undefined4 *)&pEVar7[2].field_0x4 = 0;
    wasm::StructGet::finalize();
    return pEVar7;
  }
  __assert_fail("!structFields.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0x1360,"Expression *wasm::TranslateToFuzzReader::makeStructGet(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeStructGet(Type type) {
  auto& structFields = typeStructFields[type];
  assert(!structFields.empty());
  auto [structType, fieldIndex] = pick(structFields);
  auto* ref = makeTrappingRefUse(structType);
  auto signed_ = maybeSignedGet(structType.getStruct().fields[fieldIndex]);
  return builder.makeStructGet(
    fieldIndex, ref, MemoryOrder::Unordered, type, signed_);
}